

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O0

void fiowrt1(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tokctx,tokthdef *tab,uchar *fmts,uint fmtl,
            osfildef *fp,uint flags,objnum preinit,int extc,uint prpcnt,char *filever)

{
  char cVar1;
  errcxdef *peVar2;
  FILE *__stream;
  int iVar3;
  size_t sVar4;
  char *__src;
  errcxdef *in_RSI;
  undefined8 in_RDI;
  uchar *in_R8;
  uint in_R9D;
  FILE *in_stack_00000008;
  uint in_stack_00000010;
  ushort in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  char *in_stack_00000030;
  lindef *lin;
  ulong curlen;
  ulong len_1;
  char copybuf [1024];
  osfildef *fp2;
  toksdef t;
  objnum obj_1;
  char flag_buf [2];
  long curpos;
  size_t len;
  long flag_seek;
  char fastnamebuf [4096];
  uint vsnlen;
  char *vsnhdr;
  uint xor_inc;
  uint xor_seed;
  fiowcxdef cbctx;
  time_t timer;
  tm *tblock;
  vocdef **vhsh;
  vocwdef *vw;
  vocdef *voc;
  objnum *sc;
  vocidef **v;
  vocidef ***vpg;
  int obj;
  ulong fpos;
  errcxdef *ec;
  uchar buf [89];
  int k;
  int j;
  int i;
  errcxdef *in_stack_ffffffffffffe9f8;
  errcxdef *in_stack_ffffffffffffea00;
  tokcxdef *in_stack_ffffffffffffea08;
  errcxdef *in_stack_ffffffffffffea10;
  osfildef *in_stack_ffffffffffffea18;
  tokcxdef *in_stack_ffffffffffffea20;
  size_t local_15d8;
  long local_15c0;
  ulong local_15b0;
  undefined1 local_15a8 [96];
  toksdef *in_stack_ffffffffffffeab8;
  void *in_stack_ffffffffffffeac0;
  void *in_stack_ffffffffffffeb60;
  _func_void_void_ptr_toksdef_ptr *in_stack_ffffffffffffeb68;
  toktdef *in_stack_ffffffffffffeb70;
  undefined1 local_1162 [2];
  long local_1160;
  size_t local_1158;
  long local_1150;
  uint local_13c;
  char *local_138;
  uint local_130;
  uint local_12c;
  undefined8 local_128;
  errdef *local_120;
  uint local_110;
  int local_10c;
  FILE *local_108;
  uint local_100;
  uint local_fc;
  uint local_f8;
  time_t local_f0;
  tm *local_e8;
  undefined8 *local_e0;
  tokcxdef *local_d8;
  undefined8 *local_d0;
  ushort *local_c8;
  _IO_FILE *local_c0;
  _IO_FILE **local_b8;
  uint local_ac;
  ulong local_a8;
  errdef *local_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 auStack_8f [87];
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  uchar *local_28;
  errcxdef *local_10;
  undefined8 local_8;
  
  local_a0 = in_RSI->errcxptr;
  local_12c = 0x3f;
  local_130 = 0x40;
  cVar1 = *in_stack_00000030;
  if (cVar1 != '*') {
    if (cVar1 == 'a') {
      local_138 = "v2.0.0";
      local_12c = 0x11;
      local_130 = 0x1d;
      goto LAB_001218c7;
    }
    if (cVar1 == 'b') {
      local_138 = "v2.0.1";
      goto LAB_001218c7;
    }
    if (cVar1 != 'c') {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
  }
  local_138 = "v2.2.0";
LAB_001218c7:
  local_13c = 7;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = fwrite("TADS2 bin\n\r\x1a",0xd,1,in_stack_00000008);
  if ((sVar4 != 1) || (sVar4 = fwrite(local_138,(ulong)local_13c,1,in_stack_00000008), sVar4 != 1))
  {
    errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
  }
  local_1150 = ftell(in_stack_00000008);
  oswp2(&local_98,in_stack_00000010);
  sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
  if (sVar4 != 1) {
    errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
  }
  local_f0 = time((time_t *)0x0);
  local_e8 = localtime(&local_f0);
  peVar2 = local_10 + 6;
  __src = asctime(local_e8);
  strcpy(peVar2->errcxbuf + 0x158,__src);
  sVar4 = fwrite(local_10[6].errcxbuf + 0x158,0x1a,1,in_stack_00000008);
  if (sVar4 != 1) {
    errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
  }
  if (*in_stack_00000030 != 'a') {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    local_98 = (undefined1)local_12c;
    local_97 = (undefined1)local_130;
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if (sVar4 != 1) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  if (in_stack_00000020 != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,in_stack_00000020);
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if (sVar4 != 1) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    if (*in_stack_00000030 != 'a') {
      oswp4(&local_98,0);
      sVar4 = fwrite(&local_98,4,1,in_stack_00000008);
      if (sVar4 != 1) {
        errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
      }
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  if (G_cmap_id[0] != '\0') {
    if (((*in_stack_00000030 == 'a') || (*in_stack_00000030 == 'b')) || (*in_stack_00000030 == 'c'))
    {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    local_1158 = strlen(G_cmap_ldesc);
    local_1158 = local_1158 + 1;
    oswp2(&local_98,(uint)local_1158);
    sVar4 = fwrite(G_cmap_id,4,1,in_stack_00000008);
    if (((sVar4 != 1) || (sVar4 = fwrite(&local_98,2,1,in_stack_00000008), sVar4 != 1)) ||
       (sVar4 = fwrite(G_cmap_ldesc,local_1158,1,in_stack_00000008), sVar4 != 1)) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                    (char *)in_stack_ffffffffffffea00);
  local_128 = local_8;
  local_120 = local_a0;
  local_10c = 0;
  local_100 = local_12c;
  local_fc = local_130;
  local_f8 = in_stack_00000010 & 1;
  if ((in_stack_00000010 & 0x20) == 0) {
    local_108 = (FILE *)0x0;
  }
  else {
    local_108 = (FILE *)os_create_tempfile((char *)in_stack_ffffffffffffe9f8,(char *)0x121de2);
    if (local_108 == (FILE *)0x0) {
      in_stack_00000010 = in_stack_00000010 & 0xffffffdf;
      local_1160 = ftell(in_stack_00000008);
      fseek(in_stack_00000008,local_1150,0);
      oswp2(local_1162,in_stack_00000010);
      sVar4 = fwrite(local_1162,2,1,in_stack_00000008);
      if (sVar4 != 1) {
        errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
      }
      fseek(in_stack_00000008,local_1160,0);
    }
  }
  local_110 = in_stack_00000010;
  toktheach(in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60);
  local_b8 = (_IO_FILE **)(local_10->errcxbuf + 0x3c);
  for (local_30 = 0; local_30 < 0x80; local_30 = local_30 + 1) {
    if (*local_b8 != (_IO_FILE *)0x0) {
      local_c0 = *local_b8;
      for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
        if ((*(long *)local_c0 != 0) && ((*(byte *)(*(long *)local_c0 + 8) & 0x10) != 0)) {
          *(byte *)(*(long *)local_c0 + 8) = *(byte *)(*(long *)local_c0 + 8) & 0xef;
          fiowrtobj(in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
        }
        local_c0 = (_IO_FILE *)&local_c0->_IO_read_ptr;
      }
    }
    local_b8 = local_b8 + 1;
  }
  fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
          (ulong)in_stack_ffffffffffffea00);
  __stream = local_108;
  if (local_108 != (FILE *)0x0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    local_15b0 = ftell(__stream);
    fseek(__stream,0,0);
    for (; local_15b0 != 0; local_15b0 = local_15b0 - local_15d8) {
      if (local_15b0 < 0x401) {
        local_15d8 = local_15b0;
      }
      else {
        local_15d8 = 0x400;
      }
      sVar4 = fread(local_15a8,local_15d8,1,__stream);
      if ((sVar4 != 1) || (sVar4 = fwrite(local_15a8,local_15d8,1,in_stack_00000008), sVar4 != 1)) {
        errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
      }
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
    fclose(__stream);
    osfdel_temp((char *)in_stack_ffffffffffffe9f8);
  }
  local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                    (char *)in_stack_ffffffffffffea00);
  local_b8 = (_IO_FILE **)(local_10->errcxbuf + 0x3c);
  for (local_30 = 0; local_30 < 0x80; local_30 = local_30 + 1) {
    if (*local_b8 != (_IO_FILE *)0x0) {
      local_c0 = *local_b8;
      local_ac = local_30 << 8;
      for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
        if (*(long *)local_c0 != 0) {
          local_98 = *(undefined1 *)(*(long *)local_c0 + 8);
          oswp2(&local_97,local_ac);
          oswp2(&uStack_95,(uint)*(ushort *)(*(long *)local_c0 + 10));
          oswp2(&uStack_93,(uint)*(ushort *)(*(long *)local_c0 + 0xc));
          oswp2(&uStack_91,(uint)**(byte **)local_c0);
          local_38 = 0;
          local_c8 = (ushort *)(*(long *)local_c0 + 0xe);
          for (; local_38 < (int)(uint)**(byte **)local_c0; local_38 = local_38 + 1) {
            if (0x58 < local_38 + 9U) {
              errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
            }
            oswp2(auStack_8f + (local_38 << 1),(uint)*local_c8);
            local_c8 = local_c8 + 1;
          }
          sVar4 = fwrite(&local_98,(long)(int)((uint)**(byte **)local_c0 * 2 + 9),1,
                         in_stack_00000008);
          if (sVar4 != 1) {
            errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
          }
        }
        local_c0 = (_IO_FILE *)&local_c0->_IO_read_ptr;
        local_ac = local_ac + 1;
      }
    }
    local_b8 = local_b8 + 1;
  }
  fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
          (ulong)in_stack_ffffffffffffea00);
  if (local_2c != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,local_2c);
    if ((in_stack_00000010 & 8) != 0) {
      fioxor(local_28,local_2c,local_12c,local_130);
    }
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if ((sVar4 != 1) || (sVar4 = fwrite(local_28,(ulong)local_2c,1,in_stack_00000008), sVar4 != 1))
    {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  if ((in_stack_00000010 & 4) != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,(uint)in_stack_00000018);
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if (sVar4 != 1) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                    (char *)in_stack_ffffffffffffea00);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowrq(in_stack_ffffffffffffea00,(osfildef *)in_stack_ffffffffffffe9f8,0);
  fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
          (ulong)in_stack_ffffffffffffea00);
  if (*(int *)(local_10->errcxbuf + 0x24) != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,*(uint *)(local_10->errcxbuf + 0x24));
    if ((in_stack_00000010 & 8) != 0) {
      fioxor(*(uchar **)(local_10->errcxbuf + 0x1c),*(uint *)(local_10->errcxbuf + 0x24),local_12c,
             local_130);
    }
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if ((sVar4 != 1) ||
       (sVar4 = fwrite(*(char **)(local_10->errcxbuf + 0x1c),
                       (ulong)*(uint *)(local_10->errcxbuf + 0x24),1,in_stack_00000008), sVar4 != 1)
       ) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  if (*(int *)(local_10->errcxbuf + 0x34) != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,*(uint *)(local_10->errcxbuf + 0x34));
    if ((in_stack_00000010 & 8) != 0) {
      fioxor(*(uchar **)(local_10->errcxbuf + 0x2c),*(uint *)(local_10->errcxbuf + 0x34),local_12c,
             local_130);
    }
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if ((sVar4 != 1) ||
       (sVar4 = fwrite(*(char **)(local_10->errcxbuf + 0x2c),
                       (ulong)*(uint *)(local_10->errcxbuf + 0x34),1,in_stack_00000008), sVar4 != 1)
       ) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                    (char *)in_stack_ffffffffffffea00);
  local_e0 = (undefined8 *)((long)local_10[2].errcxbuf + 0x1c4);
  for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
    for (local_d0 = (undefined8 *)*local_e0; local_d0 != (undefined8 *)0x0;
        local_d0 = (undefined8 *)*local_d0) {
      if ((in_stack_00000010 & 8) != 0) {
        fioxor((uchar *)(local_d0 + 2),
               (uint)*(byte *)(local_d0 + 1) + (uint)*(byte *)((long)local_d0 + 9),local_12c,
               local_130);
      }
      if (*(int *)((long)local_d0 + 0xc) == -1) {
        in_stack_ffffffffffffea20 = (tokcxdef *)0x0;
        local_d8 = in_stack_ffffffffffffea20;
      }
      else {
        in_stack_ffffffffffffea18 =
             *(osfildef **)
              (local_10[6].errcxbuf + ((ulong)*(uint *)((long)local_d0 + 0xc) / 2000) * 8 + 0xa4);
        in_stack_ffffffffffffea20 =
             (tokcxdef *)
             (&in_stack_ffffffffffffea18->_flags +
             ((ulong)*(uint *)((long)local_d0 + 0xc) % 2000) * 2);
        in_stack_ffffffffffffea10 = local_10;
        local_d8 = in_stack_ffffffffffffea20;
      }
      while (local_d8 != (tokcxdef *)0x0) {
        *(byte *)((long)&local_d8->tokcxerr + 7) = *(char *)((long)&local_d8->tokcxerr + 7) & 0xfb;
        oswp2(&local_98,(uint)*(byte *)(local_d0 + 1));
        oswp2(&uStack_96,(uint)*(byte *)((long)local_d0 + 9));
        oswp2(&uStack_94,(uint)(byte)*(char *)((long)&local_d8->tokcxerr + 6));
        oswp2(&uStack_92,(uint)*(ushort *)((long)&local_d8->tokcxerr + 4));
        oswp2(&uStack_90,(uint)(byte)*(char *)((long)&local_d8->tokcxerr + 7));
        sVar4 = fwrite(&local_98,10,1,in_stack_00000008);
        if ((sVar4 != 1) ||
           (sVar4 = fwrite(local_d0 + 2,
                           (long)(int)((uint)*(byte *)(local_d0 + 1) +
                                      (uint)*(byte *)((long)local_d0 + 9)),1,in_stack_00000008),
           sVar4 != 1)) {
          errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
        }
        if (*(int *)&local_d8->tokcxerr == -1) {
          in_stack_ffffffffffffea08 = (tokcxdef *)0x0;
          local_d8 = in_stack_ffffffffffffea08;
        }
        else {
          in_stack_ffffffffffffea00 =
               *(errcxdef **)
                (local_10[6].errcxbuf + ((ulong)*(uint *)&local_d8->tokcxerr / 2000) * 8 + 0xa4);
          in_stack_ffffffffffffea08 =
               (tokcxdef *)
               (in_stack_ffffffffffffea00->errcxbuf +
               ((ulong)*(uint *)&local_d8->tokcxerr % 2000) * 8 + -0x1c);
          in_stack_ffffffffffffe9f8 = local_10;
          local_d8 = in_stack_ffffffffffffea08;
        }
      }
    }
    local_e0 = local_e0 + 1;
  }
  fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
          (ulong)in_stack_ffffffffffffea00);
  if ((in_stack_00000010 & 1) != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    toktheach(in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60);
    local_98 = 0;
    sVar4 = fwrite(&local_98,4,1,in_stack_00000008);
    if (sVar4 != 1) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  if (((in_stack_00000010 & 0x82) != 0) && (*(long *)((long)local_10->errcxlgc + 0x68) != 0)) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    for (local_15c0 = *(long *)(*(long *)((long)local_10->errcxlgc + 0x68) + 0x20); local_15c0 != 0;
        local_15c0 = *(long *)(local_15c0 + 0xb0)) {
      iVar3 = (**(code **)(local_15c0 + 0x20))(local_15c0,in_stack_00000008);
      if (iVar3 != 0) {
        errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
      }
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
    if ((in_stack_00000010 & 0x80) != 0) {
      local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                        (char *)in_stack_ffffffffffffea00);
      fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
              (ulong)in_stack_ffffffffffffea00);
    }
  }
  if ((in_stack_00000010 & 0x10) != 0) {
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    oswp2(&local_98,in_stack_00000028);
    sVar4 = fwrite(&local_98,2,1,in_stack_00000008);
    if (sVar4 != 1) {
      errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
    }
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
    local_a8 = fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
                      (char *)in_stack_ffffffffffffea00);
    tok_write_defines(in_stack_ffffffffffffea20,in_stack_ffffffffffffea18,in_stack_ffffffffffffea10)
    ;
    fiowcls((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
            (ulong)in_stack_ffffffffffffea00);
  }
  fiowhd((osfildef *)in_stack_ffffffffffffea10,(errcxdef *)in_stack_ffffffffffffea08,
         (char *)in_stack_ffffffffffffea00);
  fclose(in_stack_00000008);
  if (local_10c == 0) {
    return;
  }
  errsigf(in_stack_ffffffffffffea00,(char *)in_stack_ffffffffffffe9f8,0);
}

Assistant:

static void fiowrt1(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tokctx,
                    tokthdef *tab, uchar *fmts, uint fmtl, osfildef *fp,
                    uint flags, objnum preinit, int extc, uint prpcnt,
                    char *filever)
{
    int         i;
    int         j;
    int         k;
    uchar       buf[TOKNAMMAX + 50];
    errcxdef   *ec = vctx->voccxerr;
    ulong       fpos;
    int         obj;
    vocidef  ***vpg;
    vocidef   **v;
    objnum     *sc;
    vocdef     *voc;
    vocwdef    *vw;
    vocdef    **vhsh;
    struct tm  *tblock;
    time_t      timer;
    fiowcxdef   cbctx;                    /* callback context for toktheach */
    uint        xor_seed = 63;
    uint        xor_inc = 64;
    char       *vsnhdr;
    uint        vsnlen;
    char        fastnamebuf[OSFNMAX];    /* fast-load record temp file name */
    long        flag_seek;

    /* generate appropriate file version */
    switch(filever[0])
    {
    case 'a':          /* generate .GAM compatible with pre-2.0.15 runtimes */
        vsnhdr = FIOVSNHDR2;
        vsnlen = sizeof(FIOVSNHDR2);
        xor_seed = 17;                                /* use old xor values */
        xor_inc = 29;
        break;

    case 'b':                                    /* generate 2.0.15+ format */
        vsnhdr = FIOVSNHDR3;
        vsnlen = sizeof(FIOVSNHDR3);
        break;

    case 'c':
    case '*':                                            /* current version */
        vsnhdr = FIOVSNHDR;
        vsnlen = sizeof(FIOVSNHDR);
        break;

    default:
        errsig(ec, ERR_WRTVSN);
    }

    /* write file header and version header */
    if (osfwb(fp, FIOFILHDR, sizeof(FIOFILHDR))
          || osfwb(fp, vsnhdr, vsnlen))
        errsig(ec, ERR_WRTGAM);

    /* 
     *   write the flags - remember where we wrote it in case we need to
     *   change the flags later 
     */
    flag_seek = osfpos(fp);
    oswp2(buf, flags);
    if (osfwb(fp, buf, 2))
        errsig(ec, ERR_WRTGAM);

    /* write the timestamp */
    timer = time(NULL);
    tblock = localtime(&timer);
    strcpy(vctx->voccxtim, asctime(tblock));
    if (osfwb(fp, vctx->voccxtim, (size_t)26))
        errsig(ec, ERR_WRTGAM);

    /* write xor parameters if generating post 2.0.15 .GAM file */
    if (filever[0] != 'a')
    {
        fpos = fiowhd(fp, ec, "\003XSI");
        buf[0] = xor_seed;
        buf[1] = xor_inc;
        if (osfwb(fp, buf, 2)) errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write count of external functions */
    if (extc)
    {
        fpos = fiowhd(fp, ec, "\006EXTCNT");
        oswp2(buf, extc);              /* write the external function count */
        if (osfwb(fp, buf, 2)) errsig(ec, ERR_WRTGAM);

        /* write XFCN-seek-location header if post 2.0.15 file version */
        if (filever[0] != 'a')
        {
            oswp4(buf, 0);      /* placeholder - TADSRSC sets this up later */
            if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
        }

        /* close the resource */
        fiowcls(fp, ec, fpos);
    }
    
    /* 
     *   write the character set information, if a character set was
     *   specified 
     */
    if (G_cmap_id[0] != '\0')
    {
        size_t len;

        /* this is not allowed with explicit file versions a, b, or c */
        if (filever[0] == 'a' || filever[0] == 'b' || filever[0] == 'c')
            errsig(ec, ERR_VNOCTAB);

        /* write out the CHRSET resource header */
        fpos = fiowhd(fp, ec, "\006CHRSET");

        /* write out the ID and LDESC of the internal character set */
        len = strlen(G_cmap_ldesc) + 1;
        oswp2(buf, len);
        if (osfwb(fp, G_cmap_id, 4)
            || osfwb(fp, buf, 2)
            || osfwb(fp, G_cmap_ldesc, len))
            errsig(ec, ERR_WRTGAM);

        /* close the resource */
        fiowcls(fp, ec, fpos);
    }

    /* write OBJ resource header */
    fpos = fiowhd(fp, ec, "\003OBJ");

    /* set up the symbol table callback context for writing the objects */
    cbctx.fiowcxmem = mctx;
    cbctx.fiowcxerr = ec;
    cbctx.fiowcxfp  = fp;
    cbctx.fiowcxund = 0;
    cbctx.fiowcxseed = xor_seed;
    cbctx.fiowcxinc = xor_inc;
    cbctx.fiowcxdebug = (flags & FIOFSYM);
    if (flags & FIOFFAST)
    {
        /* try creating the temp file */
        cbctx.fiowcxffp = os_create_tempfile(0, fastnamebuf);

        /* if that failed, we don't have a fast-load table after all */
        if (cbctx.fiowcxffp == 0)
        {
            long curpos;
            char flag_buf[2];
            
            /* clear the fast-load flag */
            flags &= ~FIOFFAST;

            /* 
             *   go back to the flags we wrote to the .gam file header, and
             *   re-write the new flags without the fast-load bit - since
             *   we're not going to write a fast-load table, we don't want
             *   readers thinking they're going to find one 
             */

            /* first, remember where we are right now */
            curpos = osfpos(fp);

            /* seek back to the flags and re-write the new flags */
            osfseek(fp, flag_seek, OSFSK_SET);
            oswp2(flag_buf, flags);
            if (osfwb(fp, flag_buf, 2))
                errsig(ec, ERR_WRTGAM);

            /* seek back to where we started */
            osfseek(fp, curpos, OSFSK_SET);
        }
    }
    else
        cbctx.fiowcxffp = (osfildef *)0;
    cbctx.fiowcxflg = flags;

    /* go through symbol table, and write each object */
    toktheach((toktdef *)tab, fiowrtobj, &cbctx);

    /* also write all objects created with 'new' */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        objnum obj;

        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            /* if the object was dynamically allocated, write it out */
            if (*v && (*v)->vociflg & VOCIFNEW)
            {
                toksdef t;

                /* clear the 'new' flag, as this is a static object now */
                (*v)->vociflg &= ~VOCIFNEW;

                /* set up a toksdef, and write it out */
                t.tokstyp = TOKSTOBJ;
                t.toksval = obj;
                fiowrtobj(&cbctx, &t);
            }
        }
    }
                    
    /* close the resource */
    fiowcls(fp, ec, fpos);
    
    /* copy fast-load records to output file if applicable */
    if (cbctx.fiowcxffp)
    {
        osfildef *fp2 = cbctx.fiowcxffp;
        char      copybuf[1024];
        ulong     len;
        ulong     curlen;
        
        /* start with resource header for fast-load records */
        fpos = fiowhd(fp, ec, "\003FST");

        /* get length of temp file, then rewind it */
        len = osfpos(fp2);
        osfseek(fp2, 0L, OSFSK_SET);

        /* copy the whole thing to the output file */
        while (len)
        {
            curlen = (len > sizeof(copybuf) ? sizeof(copybuf) : len);
            if (osfrb(fp2, copybuf, (size_t)curlen)
                || osfwb(fp, copybuf, (size_t)curlen))
                errsig(ec, ERR_WRTGAM);
            len -= curlen;
        }

        /* close the fast-load resource */
        fiowcls(fp, ec, fpos);
        
        /* close and delete temp file */
        osfcls(fp2);
        osfdel_temp(fastnamebuf);
    }
    
    /* write vocabulary inheritance records - start with header */
    fpos = fiowhd(fp, ec, "\003INH");
    
    /* go through inheritance records and write to file */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v)
            {
                buf[0] = (*v)->vociflg;
                oswp2(buf + 1, obj);
                oswp2(buf + 3, (*v)->vociloc);
                oswp2(buf + 5, (*v)->vociilc);
                oswp2(buf + 7, (*v)->vocinsc);
                for (k = 0, sc = (*v)->vocisc ; k < (*v)->vocinsc ; ++sc, ++k)
                {
                    if (k + 9 >= sizeof(buf)) errsig(ec, ERR_FIOMSC);
                    oswp2(buf + 9 + (k << 1), (*sc));
                }
                if (osfwb(fp, buf, 9 + (2 * (*v)->vocinsc)))
                    errsig(ec, ERR_WRTGAM);
            }
        }
    }
    
    /* close resource */
    fiowcls(fp, ec, fpos);
    
    /* write format strings */
    if (fmtl)
    {
        fpos = fiowhd(fp, ec, "\006FMTSTR");
        oswp2(buf, fmtl);
        if (flags & FIOFCRYPT) fioxor(fmts, fmtl, xor_seed, xor_inc);
        if (osfwb(fp, buf, 2) || osfwb(fp, fmts, fmtl))
            errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write preinit if preinit object was specified */
    if (flags & FIOFPRE)
    {
        fpos = fiowhd(fp, ec, "\007PREINIT");
        oswp2(buf, preinit);
        if (osfwb(fp, buf, 2)) errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write required objects out of voccxdef */
    fpos = fiowhd(fp, ec, "\003REQ");
    fiowrq(ec, fp, vctx->voccxme);
    fiowrq(ec, fp, vctx->voccxvtk);
    fiowrq(ec, fp, vctx->voccxstr);
    fiowrq(ec, fp, vctx->voccxnum);
    fiowrq(ec, fp, vctx->voccxprd);
    fiowrq(ec, fp, vctx->voccxvag);
    fiowrq(ec, fp, vctx->voccxini);
    fiowrq(ec, fp, vctx->voccxpre);
    fiowrq(ec, fp, vctx->voccxper);
    fiowrq(ec, fp, vctx->voccxprom);
    fiowrq(ec, fp, vctx->voccxpdis);
    fiowrq(ec, fp, vctx->voccxper2);
    fiowrq(ec, fp, vctx->voccxpdef);
    fiowrq(ec, fp, vctx->voccxpask);
    fiowrq(ec, fp, vctx->voccxppc);
    fiowrq(ec, fp, vctx->voccxpask2);
    fiowrq(ec, fp, vctx->voccxperp);
    fiowrq(ec, fp, vctx->voccxpostprom);
    fiowrq(ec, fp, vctx->voccxinitrestore);
    fiowrq(ec, fp, vctx->voccxpuv);
    fiowrq(ec, fp, vctx->voccxpnp);
    fiowrq(ec, fp, vctx->voccxpostact);
    fiowrq(ec, fp, vctx->voccxendcmd);
    fiowrq(ec, fp, vctx->voccxprecmd);
    fiowrq(ec, fp, vctx->voccxpask3);
    fiowrq(ec, fp, vctx->voccxpre2);
    fiowrq(ec, fp, vctx->voccxpdef2);
    fiowcls(fp, ec, fpos);
    
    /* write compound words */
    if (vctx->voccxcpl)
    {
        fpos = fiowhd(fp, ec, "\004CMPD");
        oswp2(buf, vctx->voccxcpl);
        if (flags & FIOFCRYPT)
            fioxor((uchar *)vctx->voccxcpp, (uint)vctx->voccxcpl,
                   xor_seed, xor_inc);
        if (osfwb(fp, buf, 2)
            || osfwb(fp, vctx->voccxcpp, (uint)vctx->voccxcpl))
            errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write special words */
    if (vctx->voccxspl)
    {
        fpos = fiowhd(fp, ec, "\010SPECWORD");
        oswp2(buf, vctx->voccxspl);
        if (flags & FIOFCRYPT)
            fioxor((uchar *)vctx->voccxspp, (uint)vctx->voccxspl,
                   xor_seed, xor_inc);
        if (osfwb(fp, buf, 2)
            || osfwb(fp, vctx->voccxspp, (uint)vctx->voccxspl))
            errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write vocabulary */
    fpos = fiowhd(fp, ec, "\003VOC");

    /* go through each hash chain */
    for (i = 0, vhsh = vctx->voccxhsh ; i < VOCHASHSIZ ; ++i, ++vhsh)
    {
        /* go through each word in this hash chain */
        for (voc = *vhsh ; voc ; voc = voc->vocnxt)
        {
            /* encrypt the word if desired */
            if (flags & FIOFCRYPT)
                fioxor(voc->voctxt, (uint)(voc->voclen + voc->vocln2),
                       xor_seed, xor_inc);

            /* go through each object relation attached to the word */
            for (vw = vocwget(vctx, voc->vocwlst) ; vw ;
                 vw = vocwget(vctx, vw->vocwnxt))
            {
                /* clear the 'new' flag, as this is a static object now */
                vw->vocwflg &= ~VOCFNEW;

                /* write out this object relation */
                oswp2(buf, voc->voclen);
                oswp2(buf+2, voc->vocln2);
                oswp2(buf+4, vw->vocwtyp);
                oswp2(buf+6, vw->vocwobj);
                oswp2(buf+8, vw->vocwflg);
                if (osfwb(fp, buf, 10)
                    || osfwb(fp, voc->voctxt, voc->voclen + voc->vocln2))
                    errsig(ec, ERR_WRTGAM);
            }
        }
    }
    fiowcls(fp, ec, fpos);
    
    /* write the symbol table, if desired */
    if (flags & FIOFSYM)
    {
        fpos = fiowhd(fp, ec, "\006SYMTAB");
        toktheach((toktdef *)tab, fiowrtsym, &cbctx);

        /* indicate last symbol with a length of zero */
        buf[0] = 0;
        if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);
    }
    
    /* write line source chain, if desired */
    if ((flags & (FIOFLIN | FIOFLIN2)) != 0 && vctx->voccxrun->runcxdbg != 0)
    {
        lindef *lin;

        /* write the SRC header */
        fpos = fiowhd(fp, ec, "\003SRC");

        /* write the line records */
        for (lin = vctx->voccxrun->runcxdbg->dbgcxlin ; lin ;
             lin = lin->linnxt)
        {
            /* write this record */
            if (linwrt(lin, fp))
                errsig(ec, ERR_WRTGAM);
        }

        /* done with this section */
        fiowcls(fp, ec, fpos);

        /* 
         *   if we have new-style line records, put a SRC2 header (with no
         *   block contents) in the file, so that the debugger realizes
         *   that it has new-style line records (with line numbers rather
         *   than seek offsets) 
         */
        if ((flags & FIOFLIN2) != 0)
        {
            fpos = fiowhd(fp, ec, "\004SRC2");
            fiowcls(fp, ec, fpos);
        }
    }

    /* if writing a precompiled header, write some more information */
    if (flags & FIOFBIN)
    {
        /* write property count */
        fpos = fiowhd(fp, ec, "\006PRPCNT");
        oswp2(buf, prpcnt);
        if (osfwb(fp, buf, 2)) errsig(ec, ERR_WRTGAM);
        fiowcls(fp, ec, fpos);

        /* write preprocessor symbol table */
        fpos = fiowhd(fp, ec, "\006TADSPP");
        tok_write_defines(tokctx, fp, ec);
        fiowcls(fp, ec, fpos);
    }

    /* write end-of-file resource header */
    (void)fiowhd(fp, ec, "\004$EOF");
    osfcls(fp);
    
    /* if there are undefined functions/objects, signal an error */
    if (cbctx.fiowcxund) errsig(ec, ERR_UNDEF);
}